

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  ImFont **__src;
  ImFontConfig *__src_00;
  int iVar1;
  ImFont *pIVar2;
  ImFont **__dest;
  ImFontConfig *pIVar3;
  long lVar4;
  void *__dest_00;
  int iVar5;
  int iVar6;
  
  if (this->Locked == true) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x734,"AddFont","ImGui ASSERT FAILED: %s",
                "!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
               );
  }
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x735,"AddFont","ImGui ASSERT FAILED: %s",
                "font_cfg->FontData != NULL && font_cfg->FontDataSize > 0");
  }
  if (font_cfg->SizePixels <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x736,"AddFont","ImGui ASSERT FAILED: %s","font_cfg->SizePixels > 0.0f");
  }
  if (font_cfg->MergeMode == false) {
    pIVar2 = (ImFont *)ImGui::MemAlloc(0x78);
    (pIVar2->IndexAdvanceX).Size = 0;
    (pIVar2->IndexAdvanceX).Capacity = 0;
    (pIVar2->IndexAdvanceX).Data = (float *)0x0;
    pIVar2->FallbackAdvanceX = 0.0;
    pIVar2->FontSize = 0.0;
    (pIVar2->IndexLookup).Size = 0;
    (pIVar2->IndexLookup).Capacity = 0;
    (pIVar2->IndexLookup).Data = (unsigned_short *)0x0;
    (pIVar2->Glyphs).Size = 0;
    (pIVar2->Glyphs).Capacity = 0;
    (pIVar2->Glyphs).Data = (ImFontGlyph *)0x0;
    pIVar2->EllipsisChar = 0xffff;
    pIVar2->DirtyLookupTables = false;
    pIVar2->FallbackGlyph = (ImFontGlyph *)0x0;
    (pIVar2->DisplayOffset).x = 0.0;
    (pIVar2->DisplayOffset).y = 0.0;
    pIVar2->ContainerAtlas = (ImFontAtlas *)0x0;
    pIVar2->ConfigData = (ImFontConfig *)0x0;
    pIVar2->ConfigDataCount = 0;
    pIVar2->FallbackChar = 0x3f;
    pIVar2->Scale = 1.0;
    pIVar2->Ascent = 0.0;
    pIVar2->Descent = 0.0;
    *(undefined8 *)((long)&pIVar2->Descent + 2) = 0;
    iVar1 = (this->Fonts).Size;
    if (iVar1 == (this->Fonts).Capacity) {
      if (iVar1 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar1 / 2 + iVar1;
      }
      iVar6 = iVar1 + 1;
      if (iVar1 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      __dest = (ImFont **)ImGui::MemAlloc((long)iVar6 << 3);
      __src = (this->Fonts).Data;
      if (__src != (ImFont **)0x0) {
        memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
        ImGui::MemFree((this->Fonts).Data);
      }
      (this->Fonts).Data = __dest;
      (this->Fonts).Capacity = iVar6;
      iVar1 = (this->Fonts).Size;
    }
    else {
      __dest = (this->Fonts).Data;
    }
    __dest[iVar1] = pIVar2;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  else if ((this->Fonts).Size == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x73c,"AddFont","ImGui ASSERT FAILED: %s",
                "!Fonts.empty() && \"Cannot use MergeMode for the first font\"");
  }
  iVar1 = (this->ConfigData).Size;
  if (iVar1 == (this->ConfigData).Capacity) {
    if (iVar1 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar1 / 2 + iVar1;
    }
    iVar6 = iVar1 + 1;
    if (iVar1 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    pIVar3 = (ImFontConfig *)ImGui::MemAlloc((long)iVar6 * 0x88);
    __src_00 = (this->ConfigData).Data;
    if (__src_00 != (ImFontConfig *)0x0) {
      memcpy(pIVar3,__src_00,(long)(this->ConfigData).Size * 0x88);
      ImGui::MemFree((this->ConfigData).Data);
    }
    (this->ConfigData).Data = pIVar3;
    (this->ConfigData).Capacity = iVar6;
    iVar1 = (this->ConfigData).Size;
  }
  else {
    pIVar3 = (this->ConfigData).Data;
  }
  memcpy(pIVar3 + iVar1,font_cfg,0x88);
  iVar5 = (this->ConfigData).Size;
  iVar1 = iVar5 + 1;
  (this->ConfigData).Size = iVar1;
  if (iVar5 < 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    iVar1 = (this->ConfigData).Size;
  }
  pIVar3 = (this->ConfigData).Data;
  lVar4 = (long)iVar1;
  pIVar2 = pIVar3[lVar4 + -1].DstFont;
  if (pIVar2 == (ImFont *)0x0) {
    iVar1 = (this->Fonts).Size;
    if (iVar1 < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
      iVar1 = (this->Fonts).Size;
    }
    pIVar2 = (this->Fonts).Data[(long)iVar1 + -1];
    pIVar3[lVar4 + -1].DstFont = pIVar2;
  }
  if (pIVar3[lVar4 + -1].FontDataOwnedByAtlas == false) {
    __dest_00 = ImGui::MemAlloc((long)pIVar3[lVar4 + -1].FontDataSize);
    pIVar3[lVar4 + -1].FontData = __dest_00;
    pIVar3[lVar4 + -1].FontDataOwnedByAtlas = true;
    memcpy(__dest_00,font_cfg->FontData,(long)pIVar3[lVar4 + -1].FontDataSize);
    pIVar2 = pIVar3[lVar4 + -1].DstFont;
  }
  if (pIVar2->EllipsisChar == 0xffff) {
    pIVar2->EllipsisChar = font_cfg->EllipsisChar;
  }
  ClearTexData(this);
  return pIVar3[lVar4 + -1].DstFont;
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty() && "Cannot use MergeMode for the first font"); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (new_font_cfg.DstFont == NULL)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = IM_ALLOC(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    if (new_font_cfg.DstFont->EllipsisChar == (ImWchar)-1)
        new_font_cfg.DstFont->EllipsisChar = font_cfg->EllipsisChar;

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}